

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O3

MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  EncRcTask *pEVar4;
  RK_U32 RVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  RK_S32 RVar9;
  size_t sVar10;
  void *pvVar11;
  ulong uVar12;
  MppBuffer pvVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  undefined8 uVar23;
  RK_U8 dmv_qpel_penalty [128];
  RK_U8 dmv_penalty [128];
  uint auStack_698 [32];
  uint auStack_618 [294];
  undefined8 uStack_180;
  uint local_16c;
  ulong local_168;
  int *local_160;
  EncRcTask *local_158;
  int *local_150;
  long local_148;
  ulong local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pEVar4 = task->rc_task;
  local_150 = *(int **)((long)hal + 0x260);
  local_160 = *(int **)((long)hal + 0x268);
  lVar18 = *(long *)((long)hal + 0x270);
  uVar19 = local_150[0xf];
  local_168 = (ulong)(uint)local_150[0x10];
  uStack_180 = 0x2304c7;
  sVar10 = mpp_packet_get_length(task->packet);
  if (*(int *)((long)hal + 0x144) != 0) {
    local_168 = (ulong)*(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
    uVar19 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  }
  local_140 = (ulong)uVar19;
  *(RK_S32 *)((long)hal + 0x198) = (pEVar4->info).quality_target;
  uVar1 = (pEVar4->info).quality_max;
  uVar2 = (pEVar4->info).quality_min;
  uVar23 = CONCAT44(uVar1,uVar2);
  *(undefined8 *)((long)hal + 0x19c) = uVar23;
  if ((hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x23053d;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x23057a;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","frame %d generate regs now","hal_h264e_vepu2_gen_regs_v2",
               (ulong)*(ushort *)((long)&pEVar4->frm + 6));
  }
  uStack_180 = 0x230592;
  local_158 = pEVar4;
  h264e_vepu_mbrc_prepare
            (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task);
  uStack_180 = 0x2305a8;
  h264e_vepu_slice_split_cfg
            (*(H264eSlice **)((long)hal + 0x270),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task,*hal);
  pvVar13 = task->output;
  uStack_180 = 0x2305bb;
  local_16c = mpp_buffer_get_fd_with_caller(pvVar13,"setup_output_packet");
  uVar19 = (uint)sVar10;
  local_148 = lVar18;
  if (uVar19 == 0) {
    uVar16 = 0;
    uVar21 = 0;
  }
  else {
    uStack_180 = 0x2305d8;
    pvVar11 = mpp_buffer_get_ptr_with_caller(pvVar13,"setup_output_packet");
    uVar16 = *(uint *)((long)pvVar11 + (ulong)(uVar19 & 0xfffffff8));
    uVar20 = *(uint *)((long)pvVar11 + (ulong)(uVar19 & 0xfffffff8) + 4);
    uVar21 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    uVar16 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
  }
  uVar20 = uVar19 & 0xfffffff8;
  if ((hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x23062c;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","offset %d offset8 %d\n","setup_output_packet",
               sVar10 & 0xffffffff,(ulong)uVar20);
  }
  *(uint *)((long)hal + 0x434) = local_16c;
  uStack_180 = 0x230647;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x4d,uVar20);
  uStack_180 = 0x230656;
  sVar10 = mpp_buffer_get_size_with_caller(pvVar13,"setup_output_packet");
  *(uint *)((long)hal + 0x3d4) = (int)sVar10 - uVar20 >> 3 & 0xfffffff8;
  if ((hal_h264e_debug & 8) != 0) {
    uStack_180 = 0x23069a;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","msb %08x lsb %08x","setup_output_packet",(ulong)uVar21,
               (ulong)uVar16);
  }
  RVar5 = hal_h264e_debug;
  *(uint *)((long)hal + 0x3cc) = uVar21;
  *(uint *)((long)hal + 0x3d0) = uVar16;
  uVar21 = uVar19 * 8 & 0x38;
  *(uint *)((long)hal + 0x214) = uVar19;
  *(uint *)((long)hal + 0x218) = uVar21 >> 3;
  *(undefined4 *)((long)hal + 0x21c) = 0;
  uVar19 = *(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
  uVar16 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  lVar18 = *hal;
  iVar8 = *(int *)(lVar18 + 0x16c);
  uVar3 = *(ushort *)((long)&local_158->frm + 6);
  iVar15 = *(int *)(lVar18 + 0xc4);
  if ((RVar5 & 2) != 0) {
    uStack_180 = 0x230734;
    local_16c = uVar16;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter\n","setup_intra_refresh");
    lVar18 = *hal;
    uVar16 = local_16c;
  }
  uVar20 = 0;
  if ((*(int *)(lVar18 + 0x164) == 0) || (((local_158->frm).val & 0x4000000000) == 0)) {
    uVar17 = 0;
    uVar7 = 0;
  }
  else {
    iVar15 = (int)((long)(ulong)uVar3 % (long)iVar15);
    if (*(int *)(lVar18 + 0x168) == 1) {
      uVar14 = iVar15 * iVar8 - 2;
      uVar17 = (iVar15 + 1) * iVar8 - 1;
      uVar20 = uVar19;
      if ((int)uVar14 < (int)uVar19) {
        uVar20 = uVar14;
      }
      if ((int)uVar17 < (int)uVar19) {
        uVar19 = uVar17;
      }
      if ((int)uVar17 < 0) {
        uVar19 = 0;
      }
      uVar7 = (uVar20 & 0xff) << 8;
      uVar17 = uVar16;
    }
    else {
      uVar17 = 0;
      uVar7 = 0;
      if (*(int *)(lVar18 + 0x168) != 0) goto LAB_002307e0;
      uVar14 = iVar15 * iVar8 - 2;
      uVar20 = (iVar15 + 1) * iVar8 - 1;
      uVar7 = uVar16;
      if ((int)uVar14 < (int)uVar16) {
        uVar7 = uVar14;
      }
      uVar7 = uVar7 << 0x18;
      if ((int)uVar20 < (int)uVar16) {
        uVar16 = uVar20;
      }
      uVar17 = uVar16;
      if ((int)uVar20 < 0) {
        uVar17 = 0;
      }
    }
    uVar20 = uVar19;
    if ((int)uVar14 < 0) {
      uVar7 = 0;
    }
  }
LAB_002307e0:
  *(uint *)((long)hal + 0x3b8) = uVar20 & 0xff | uVar7 | (uVar17 & 0xff) << 0x10;
  if ((hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x23082a;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave, ret %d\n","setup_intra_refresh",0);
  }
  lVar18 = local_148;
  *(undefined4 *)((long)hal + 0x3d8) = 0x1000;
  *(undefined4 *)((long)hal + 0x3dc) = *(undefined4 *)((long)hal + 0x208);
  uVar19 = (uint)local_140;
  iVar15 = (*(uint *)(local_148 + 0x40) & 3) * 0x200000;
  iVar8 = iVar15 + 0x100000;
  if (local_160[2] == 0) {
    iVar8 = iVar15;
  }
  uVar20 = iVar8 + (uint)(0xe10 < uVar19 * (int)local_168) * 0x10000000;
  uVar16 = uVar20 + 0x20000;
  if (local_160[0x11] == 0) {
    uVar16 = uVar20;
  }
  uVar20 = uVar16 + 0x10000;
  if (*local_150 < 0x20) {
    uVar20 = uVar16;
  }
  *(uint *)((long)hal + 0x3ec) = (*(uint *)((long)hal + 0x210) & 0x7f) << 8 | uVar20;
  uVar20 = uVar19 + (int)local_168;
  uVar16 = 1;
  if (uVar20 < 0xc9) {
    uVar16 = (uint)(byte)(200 / (byte)uVar20);
  }
  iVar8 = *(int *)((long)hal + 0x198);
  uVar20 = 0xff00;
  if (uVar16 * h264_skip_sad_penalty[iVar8] < 0xff) {
    uVar20 = uVar16 * h264_skip_sad_penalty[iVar8] * 0x100;
  }
  uVar16 = (-*(uint *)((long)hal + 0xe4) & 0xc) << 2;
  if ((*(uint *)((long)hal + 0xe4) & 0xf) == 0) {
    uVar16 = 0;
  }
  uVar17 = -*(uint *)((long)hal + 0xe8) & 0xf;
  if ((*(uint *)((long)hal + 0xe8) & 0xf) == 0) {
    uVar17 = 0;
  }
  *(uint *)((long)hal + 0x3f0) = uVar21 << 0x10 | uVar20 | uVar16 | uVar17;
  *(uint *)((long)hal + 0x3f4) = *(uint *)((long)hal + 0x108) & 0x3fff;
  *(uint *)((long)hal + 0x404) =
       (uint)*(ushort *)((long)hal + 0x1ac) | *(int *)((long)hal + 0x1a8) << 0x10;
  *(uint *)((long)hal + 0x408) =
       (uint)*(ushort *)((long)hal + 0x1b4) | *(int *)((long)hal + 0x1b0) << 0x10;
  *(uint *)((long)hal + 0x40c) =
       (uint)*(ushort *)((long)hal + 0x1bc) | *(int *)((long)hal + 0x1b8) << 0x10;
  *(uint *)((long)hal + 0x410) =
       (uint)*(ushort *)((long)hal + 0x1c4) | *(int *)((long)hal + 0x1c0) << 0x10;
  *(uint *)((long)hal + 0x414) =
       (uint)*(ushort *)((long)hal + 0x1cc) | *(int *)((long)hal + 0x1c8) << 0x10;
  *(uint *)((long)hal + 0x418) =
       (uint)*(ushort *)((long)hal + 0x1d4) | *(int *)((long)hal + 0x1d0) << 0x10;
  *(uint *)((long)hal + 0x41c) =
       (uint)*(ushort *)((long)hal + 0x1dc) | *(int *)((long)hal + 0x1d8) << 0x10;
  *(uint *)((long)hal + 0x420) =
       (uint)*(ushort *)((long)hal + 0x1e4) | *(int *)((long)hal + 0x1e0) << 0x10;
  *(uint *)((long)hal + 0x424) =
       *(uint *)((long)hal + 0x1ec) & 0xf |
       (*(uint *)((long)hal + 0x1f0) & 0xf) << 4 |
       (*(uint *)((long)hal + 500) & 0xf) << 8 |
       (*(uint *)((long)hal + 0x1f8) & 0xf) << 0xc |
       (*(uint *)((long)hal + 0x1fc) & 0xf) << 0x10 |
       (*(uint *)((long)hal + 0x200) & 0xf) << 0x14 | (*(uint *)((long)hal + 0x204) & 0xf) << 0x18;
  *(uint *)((long)hal + 0x428) =
       ((*(uint *)((long)hal + 0xe0) & 0xf) << 4 | (*(uint *)((long)hal + 0x20c) & 0x3f) << 0x18) +
       (*(uint *)((long)hal + 0x144) & 3) * 4 + 1;
  *(uint *)((long)hal + 0x42c) =
       (uint)(ushort)h264_inter_favor[iVar8] | h264_intra16_favor[iVar8] << 0x10;
  uVar20 = (local_160[0xb] & 0x1fU) << 0xd |
           (*(uint *)(local_148 + 0x4c) & 0xf) << 0x12 |
           (*(uint *)(local_148 + 0x48) & 0xf) << 0x16 | local_160[9] << 0x1a;
  uVar21 = *(uint *)(local_148 + 0x6c) & 0xf;
  uVar16 = uVar20 + 0x20 + uVar21 * 2;
  if (*(int *)(local_148 + 0x44) == 0) {
    uVar16 = uVar20 + uVar21 * 2;
  }
  *(uint *)((long)hal + 0x430) = local_160[0xf] != 0 | uVar16;
  *(undefined8 *)((long)hal + 0x43c) = 0;
  if (*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) {
    iVar8 = 0;
  }
  else {
    uStack_180 = 0x230b2e;
    iVar8 = mpp_buffer_get_fd_with_caller
                      (*(MppBuffer *)((long)hal + 0x28),"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x444) = iVar8;
  uVar16 = (uVar19 & 0xff) << 8 | ((uint)local_168 & 0xff) * 0x1010000 | uVar19 & 0xff;
  *(uint *)((long)hal + 0x448) = uVar16;
  *(uint *)((long)hal + 0x44c) = uVar16;
  *(undefined4 *)((long)hal + 0x478) = 0;
  *(uint *)((long)hal + 0x47c) =
       (uint)*(ushort *)((long)hal + 0x130) | *(int *)((long)hal + 0x134) << 0x10;
  *(uint *)((long)hal + 0x480) =
       (uint)*(ushort *)((long)hal + 0x138) | *(int *)((long)hal + 0x13c) << 0x10;
  *(uint *)((long)hal + 0x484) = (uint)*(ushort *)((long)hal + 0x140);
  *(uint *)((long)hal + 0x488) =
       *(byte *)((long)hal + 0x128) & 0x1f |
       (*(byte *)((long)hal + 0x129) & 0x1f) << 8 | (*(byte *)((long)hal + 0x12a) & 0x1f) << 0x10;
  iVar8 = *(int *)((long)hal + 0x198);
  *(RK_U32 *)((long)hal + 0x48c) =
       (h264_diff_mv_penalty[iVar8] & 0x3ff) * 0x200800 +
       (h264_diff_mv_penalty4p[iVar8] & 0x3ff) * 2 + 1;
  *(uint *)((long)hal + 0x490) =
       *(uint *)((long)hal + 0x1a4) & 0xfff |
       (*(uint *)((long)hal + 0x19c) & 0x3f) << 0xe |
       (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x14 | iVar8 << 0x1a;
  *(undefined4 *)((long)hal + 0x498) = 0xa00000;
  *(uint *)((long)hal + 0x4a4) =
       (*(byte *)((long)hal + 0x12d) & 1) * 0x20000000 +
       ((*(byte *)((long)hal + 300) & 1) << 0x1e | (uint)*(byte *)((long)hal + 299) << 0x1f) +
       0x1c000000;
  *(uint *)((long)hal + 0x4a8) =
       (uint)*(ushort *)(lVar18 + 0x34) |
       (h264_prev_mode_favor[iVar8] & 0xff) << 0x10 | *local_160 << 0x18;
  *(undefined4 *)((long)hal + 0x4b4) = 0x400;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  lVar22 = 0;
  do {
    local_b8[lVar22] = (char)lVar22;
    uStack_180 = 0x230d48;
    RVar9 = exp_golomb_signed((RK_S32)lVar22);
    uVar6 = 0xff;
    if (RVar9 < 0xff) {
      uStack_180 = 0x230d5c;
      RVar9 = exp_golomb_signed((RK_S32)lVar22);
      uVar6 = (undefined1)RVar9;
    }
    local_138[lVar22] = uVar6;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x80);
  lVar22 = 0x560;
  do {
    uVar16 = *(uint *)((long)auStack_618 + lVar22);
    *(uint *)((long)hal + lVar22 + -0x80) =
         uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    uVar16 = *(uint *)((long)auStack_698 + lVar22);
    *(uint *)((long)hal + lVar22) =
         uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    uVar12 = lVar22 - 0x560;
    lVar22 = lVar22 + 4;
  } while (uVar12 < 0x7c);
  *(undefined4 *)((long)hal + 0x3c0) = *(undefined4 *)((long)hal + 0x148);
  if (*(RK_U32 *)((long)hal + 0x180) != 0) {
    uStack_180 = 0x230dc2;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x30,*(RK_U32 *)((long)hal + 0x180));
  }
  *(undefined4 *)((long)hal + 0x3c4) = *(undefined4 *)((long)hal + 0x14c);
  if (*(RK_U32 *)((long)hal + 0x184) != 0) {
    uStack_180 = 0x230de6;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x31,*(RK_U32 *)((long)hal + 0x184));
  }
  *(undefined4 *)((long)hal + 0x3c8) = *(undefined4 *)((long)hal + 0x150);
  if (*(RK_U32 *)((long)hal + 0x188) != 0) {
    uStack_180 = 0x230e0a;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x32,*(RK_U32 *)((long)hal + 0x188));
  }
  uStack_180 = 0x230e12;
  pvVar13 = h264e_vepu_buf_get_nal_size_table((HalH264eVepuBufs *)((long)hal + 0x18));
  if (pvVar13 == (MppBuffer)0x0) {
    iVar8 = 0;
  }
  else {
    uStack_180 = 0x230e26;
    iVar8 = mpp_buffer_get_fd_with_caller(pvVar13,"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x438) = iVar8;
  *(undefined8 *)((long)hal + 0x3fc) = *(undefined8 *)((long)hal + 0x154);
  uStack_180 = 0x230e4f;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x40,*(RK_U32 *)((long)hal + 0x48));
  *(undefined8 *)((long)hal + 0x3e0) = *(undefined8 *)((long)hal + 0x15c);
  uStack_180 = 0x230e6e;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x39,*(RK_U32 *)((long)hal + 0x48));
  *(uint *)((long)hal + 0x49c) =
       (*(uint *)(lVar18 + 0x68) & 3) * 0x40 +
       ((uVar19 & 0x1ff) << 8 | ((uint)local_168 & 0x1ff) << 0x14) + 0x31;
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    uStack_180 = 0x230ed2;
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    //MPP_RET ret = MPP_OK;
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuBufs *hw_bufs = &ctx->hw_bufs;
    HalH264eVepuPrep *hw_prep = &ctx->hw_prep;
    HalH264eVepuAddr *hw_addr = &ctx->hw_addr;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    VepuOffsetCfg *hw_offset = &ctx->hw_offset;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    EncFrmStatus *frm = &task->rc_task->frm;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    RK_U32 *reg = ctx->regs_set.val;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 offset = mpp_packet_get_length(task->packet);
    RK_U32 first_free_bit = 0;
    RK_U32 val = 0;
    RK_S32 i = 0;

    if (hw_prep->rotation) {
        mb_w = ctx->sps->pic_height_in_mbs;
        mb_h = ctx->sps->pic_width_in_mbs;
    }

    hw_mbrc->qp_init = rc_info->quality_target;
    hw_mbrc->qp_max = rc_info->quality_max;
    hw_mbrc->qp_min = rc_info->quality_min;

    hal_h264e_dbg_func("enter %p\n", hal);

    hal_h264e_dbg_detail("frame %d generate regs now", frm->seq_idx);

    // prepare mb rc config
    h264e_vepu_mbrc_prepare(ctx->rc_ctx, &ctx->hw_mbrc, task->rc_task);
    h264e_vepu_slice_split_cfg(ctx->slice, &ctx->hw_mbrc, task->rc_task, ctx->cfg);

    /* setup output address with offset */
    first_free_bit = setup_output_packet(ctx, reg, task->output, offset);

    /* set extra byte for header */
    hw_mbrc->hdr_strm_size = offset;
    hw_mbrc->hdr_free_size = first_free_bit / 8;
    hw_mbrc->out_strm_size = 0;

    /*
     * The hardware needs only the value for luma plane, because
     * values of other planes are calculated internally based on
     * format setting.
     */
    setup_intra_refresh(ctx, frm);

    val = VEPU_REG_AXI_CTRL_READ_ID(0);
    val |= VEPU_REG_AXI_CTRL_WRITE_ID(0);
    val |= VEPU_REG_AXI_CTRL_BURST_LEN(16);
    val |= VEPU_REG_AXI_CTRL_INCREMENT_MODE(0);
    val |= VEPU_REG_AXI_CTRL_BIRST_DISCARD(0);
    H264E_HAL_SET_REG(reg, VEPU_REG_AXI_CTRL, val);

    H264E_HAL_SET_REG(reg, VEPU_QP_ADJUST_MAD_DELTA_ROI,
                      hw_mbrc->mad_qp_change);

    val = 0;
    if (mb_w * mb_h > 3600)
        val = VEPU_REG_DISABLE_QUARTER_PIXEL_MV;
    val |= VEPU_REG_CABAC_INIT_IDC(slice->cabac_init_idc);
    if (pps->entropy_coding_mode)
        val |= VEPU_REG_ENTROPY_CODING_MODE;
    if (pps->transform_8x8_mode)
        val |= VEPU_REG_H264_TRANS8X8_MODE;
    if (sps->profile_idc > 31)
        val |= VEPU_REG_H264_INTER4X4_MODE;
    /*reg |= VEPU_REG_H264_STREAM_MODE;*/
    val |= VEPU_REG_H264_SLICE_SIZE(hw_mbrc->slice_size_mb_rows);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL0, val);

    RK_U32 scaler = MPP_MAX(1, 200 / (mb_w + mb_h));

    RK_U32 skip_penalty = MPP_MIN(255, h264_skip_sad_penalty[hw_mbrc->qp_init] * scaler);

    RK_U32 overfill_r = (hw_prep->src_w & 0x0f) ?
                        ((16 - (hw_prep->src_w & 0x0f)) / 4) : 0;

    RK_U32 overfill_b = (hw_prep->src_h & 0x0f) ?
                        (16 - (hw_prep->src_h & 0x0f)) : 0;

    val = VEPU_REG_STREAM_START_OFFSET(first_free_bit) |
          VEPU_REG_SKIP_MACROBLOCK_PENALTY(skip_penalty) |
          VEPU_REG_IN_IMG_CTRL_OVRFLR_D4(overfill_r) |
          VEPU_REG_IN_IMG_CTRL_OVRFLB(overfill_b);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_OVER_FILL_STRM_OFFSET, val);

    // When offset is zero row length should be total 16 aligned width
    val = VEPU_REG_IN_IMG_CHROMA_OFFSET(0)
          | VEPU_REG_IN_IMG_LUMA_OFFSET(0)
          | VEPU_REG_IN_IMG_CTRL_ROW_LEN(hw_prep->pixel_stride);

    H264E_HAL_SET_REG(reg, VEPU_REG_INPUT_LUMA_INFO, val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[0])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(0), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[2])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(1), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[4])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(2), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[6])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[7]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(3), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[8])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[9]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(4), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[0])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(0), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[2])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(1), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[4])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(2), val);

    val = VEPU_REG_CHKPT_DELTA_QP_CHK6(hw_mbrc->cp_delta_qp[6])
          | VEPU_REG_CHKPT_DELTA_QP_CHK5(hw_mbrc->cp_delta_qp[5])
          | VEPU_REG_CHKPT_DELTA_QP_CHK4(hw_mbrc->cp_delta_qp[4])
          | VEPU_REG_CHKPT_DELTA_QP_CHK3(hw_mbrc->cp_delta_qp[3])
          | VEPU_REG_CHKPT_DELTA_QP_CHK2(hw_mbrc->cp_delta_qp[2])
          | VEPU_REG_CHKPT_DELTA_QP_CHK1(hw_mbrc->cp_delta_qp[1])
          | VEPU_REG_CHKPT_DELTA_QP_CHK0(hw_mbrc->cp_delta_qp[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_DELTA_QP, val);

    val = VEPU_REG_MAD_THRESHOLD(hw_mbrc->mad_threshold)
          | VEPU_REG_IN_IMG_CTRL_FMT(hw_prep->src_fmt)
          | VEPU_REG_IN_IMG_ROTATE_MODE(hw_prep->rotation)
          | VEPU_REG_SIZE_TABLE_PRESENT; //FIXED
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL1, val);

    val = VEPU_REG_INTRA16X16_MODE(h264_intra16_favor[hw_mbrc->qp_init])
          | VEPU_REG_INTER_MODE(h264_inter_favor[hw_mbrc->qp_init]);
    H264E_HAL_SET_REG(reg, VEPU_REG_INTRA_INTER_MODE, val);

    val = VEPU_REG_PPS_INIT_QP(pps->pic_init_qp)
          | VEPU_REG_SLICE_FILTER_ALPHA(slice->slice_alpha_c0_offset_div2)
          | VEPU_REG_SLICE_FILTER_BETA(slice->slice_beta_offset_div2)
          | VEPU_REG_CHROMA_QP_OFFSET(pps->chroma_qp_index_offset)
          | VEPU_REG_IDR_PIC_ID(slice->idr_pic_id);

    if (slice->disable_deblocking_filter_idc)
        val |= VEPU_REG_FILTER_DISABLE;

    if (pps->constrained_intra_pred)
        val |= VEPU_REG_CONSTRAINED_INTRA_PREDICTION;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL2, val);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_NEXT_PIC, 0);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_MV_OUT, 0);

    MppBuffer cabac_table = hw_bufs->cabac_table;
    RK_S32 cabac_table_fd = cabac_table ? mpp_buffer_get_fd(cabac_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_CABAC_TBL, cabac_table_fd);

    val = VEPU_REG_ROI1_TOP_MB(mb_h)
          | VEPU_REG_ROI1_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI1_LEFT_MB(mb_w)
          | VEPU_REG_ROI1_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI1, val);

    val = VEPU_REG_ROI2_TOP_MB(mb_h)
          | VEPU_REG_ROI2_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI2_LEFT_MB(mb_w)
          | VEPU_REG_ROI2_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI2, val);
    H264E_HAL_SET_REG(reg, VEPU_REG_STABLILIZATION_OUTPUT, 0);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFB(hw_prep->color_conversion_coeff_b)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFA(hw_prep->color_conversion_coeff_a);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF1, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFE(hw_prep->color_conversion_coeff_e)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFC(hw_prep->color_conversion_coeff_c);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF2, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFF(hw_prep->color_conversion_coeff_f);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF3, val);

    val = VEPU_REG_RGB_MASK_B_MSB(hw_prep->b_mask_msb)
          | VEPU_REG_RGB_MASK_G_MSB(hw_prep->g_mask_msb)
          | VEPU_REG_RGB_MASK_R_MSB(hw_prep->r_mask_msb);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB_MASK_MSB, val); //FIXED

    {
        RK_U32 diff_mv_penalty[3] = {0};
        diff_mv_penalty[0] = h264_diff_mv_penalty4p[hw_mbrc->qp_init];
        diff_mv_penalty[1] = h264_diff_mv_penalty[hw_mbrc->qp_init];
        diff_mv_penalty[2] = h264_diff_mv_penalty[hw_mbrc->qp_init];

        val = VEPU_REG_1MV_PENALTY(diff_mv_penalty[1])
              | VEPU_REG_QMV_PENALTY(diff_mv_penalty[2])
              | VEPU_REG_4MV_PENALTY(diff_mv_penalty[0]);
    }

    val |= VEPU_REG_SPLIT_MV_MODE_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_MV_PENALTY, val);

    val = VEPU_REG_H264_LUMA_INIT_QP(hw_mbrc->qp_init)
          | VEPU_REG_H264_QP_MAX(hw_mbrc->qp_max)
          | VEPU_REG_H264_QP_MIN(hw_mbrc->qp_min)
          | VEPU_REG_H264_CHKPT_DISTANCE(hw_mbrc->cp_distance_mbs);
    H264E_HAL_SET_REG(reg, VEPU_REG_QP_VAL, val);

    val = VEPU_REG_ZERO_MV_FAVOR_D2(10);
    H264E_HAL_SET_REG(reg, VEPU_REG_MVC_RELATE, val);

    val = VEPU_REG_OUTPUT_SWAP32
          | VEPU_REG_OUTPUT_SWAP16
          | VEPU_REG_OUTPUT_SWAP8
          | VEPU_REG_INPUT_SWAP8_(hw_prep->swap_8_in)
          | VEPU_REG_INPUT_SWAP16_(hw_prep->swap_16_in)
          | VEPU_REG_INPUT_SWAP32_(hw_prep->swap_32_in);
    H264E_HAL_SET_REG(reg, VEPU_REG_DATA_ENDIAN, val);

    val = VEPU_REG_PPS_ID(pps->pps_id)
          | VEPU_REG_INTRA_PRED_MODE(h264_prev_mode_favor[hw_mbrc->qp_init])
          | VEPU_REG_FRAME_NUM(slice->frame_num);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL3, val);

    val = VEPU_REG_INTERRUPT_TIMEOUT_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_INTERRUPT, val);

    {
        RK_U8 dmv_penalty[128] = {0};
        RK_U8 dmv_qpel_penalty[128] = {0};

        for (i = 0; i < 128; i++) {
            dmv_penalty[i] = i;
            dmv_qpel_penalty[i] = MPP_MIN(255, exp_golomb_signed(i));
        }

        for (i = 0; i < 128; i += 4) {
            val = VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i], 3);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_PENALTY_TBL(i / 4), val);

            val = VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                      dmv_qpel_penalty[i], 3);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_Q_PIXEL_PENALTY_TBL(i / 4), val);
        }
    }

    /* set buffers addr */
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_LUMA, hw_addr->orig[0]);
    if (hw_offset->offset_byte[0])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_LUMA >> 2,
                               hw_offset->offset_byte[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CB, hw_addr->orig[1]);
    if (hw_offset->offset_byte[1])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CB >> 2,
                               hw_offset->offset_byte[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CR, hw_addr->orig[2]);
    if (hw_offset->offset_byte[2])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CR >> 2,
                               hw_offset->offset_byte[2]);

    MppBuffer nal_size_table = h264e_vepu_buf_get_nal_size_table(hw_bufs);
    RK_S32 nal_size_table_fd = nal_size_table ? mpp_buffer_get_fd(nal_size_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_OUTPUT_CTRL, nal_size_table_fd);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_LUMA,   hw_addr->recn[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_CHROMA, hw_addr->recn[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REC_CHROMA >> 2, hw_bufs->yuv_size);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_LUMA,   hw_addr->refr[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_CHROMA, hw_addr->refr[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REF_CHROMA >> 2, hw_bufs->yuv_size);

    /* set important encode mode info */
    val = VEPU_REG_MB_HEIGHT(mb_h)
          | VEPU_REG_MB_WIDTH(mb_w)
          | VEPU_REG_PIC_TYPE(slice->idr_flag)
          | VEPU_REG_ENCODE_FORMAT(3)
          | VEPU_REG_ENCODE_ENABLE;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENCODE_START, val);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}